

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusservicewatcher.cpp
# Opt level: O0

void __thiscall
QDBusServiceWatcherPrivate::setConnection
          (QDBusServiceWatcherPrivate *this,QStringList *newServices,QDBusConnection *newConnection,
          WatchMode newMode)

{
  bool bVar1;
  parameter_type pQVar2;
  const_iterator o;
  undefined8 in_RDX;
  QList<QString> *in_RDI;
  long in_FS_OFFSET;
  QString *s_1;
  QStringList *__range2_1;
  QString *s;
  QStringList *__range2;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  const_iterator __end2;
  const_iterator __begin2;
  WatchMode oldMode;
  QStringList oldServices;
  parameter_type in_stack_ffffffffffffff48;
  QString *in_stack_ffffffffffffff68;
  QDBusServiceWatcherPrivate *in_stack_ffffffffffffff70;
  const_iterator local_58;
  Int local_4c;
  QString *local_48;
  const_iterator local_40;
  const_iterator local_38;
  Int local_2c;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  QFlags<QDBusServiceWatcher::WatchModeFlag> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  QPropertyData<QList<QString>_>::valueBypassingBindings
            ((QPropertyData<QList<QString>_> *)(in_RDI + 5));
  QList<QString>::QList(in_RDI,in_stack_ffffffffffffff48);
  local_2c = 0xaaaaaaaa;
  pQVar2 = QPropertyData<QFlags<QDBusServiceWatcher::WatchModeFlag>_>::valueBypassingBindings
                     ((QPropertyData<QFlags<QDBusServiceWatcher::WatchModeFlag>_> *)&in_RDI[6].d.ptr
                     );
  local_2c = (pQVar2->super_QFlagsStorageHelper<QDBusServiceWatcher::WatchModeFlag,_4>).
             super_QFlagsStorage<QDBusServiceWatcher::WatchModeFlag>.i;
  bVar1 = QDBusConnection::isConnected((QDBusConnection *)in_RDI);
  if (bVar1) {
    in_stack_ffffffffffffff70 = (QDBusServiceWatcherPrivate *)&local_28;
    local_38.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    local_38 = QList<QString>::begin(in_RDI);
    local_40.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    local_40 = QList<QString>::end(in_RDI);
    while( true ) {
      local_48 = local_40.i;
      bVar1 = QList<QString>::const_iterator::operator!=(&local_38,local_40);
      if (!bVar1) break;
      in_stack_ffffffffffffff68 = QList<QString>::const_iterator::operator*(&local_38);
      local_4c = local_2c;
      removeService(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                    (QFlagsStorageHelper<QDBusServiceWatcher::WatchModeFlag,_4>)
                    SUB84((ulong)in_RDX >> 0x20,0));
      QList<QString>::const_iterator::operator++(&local_38);
    }
  }
  QDBusConnection::operator=((QDBusConnection *)in_RDI,(QDBusConnection *)in_stack_ffffffffffffff48)
  ;
  QPropertyData<QFlags<QDBusServiceWatcher::WatchModeFlag>_>::setValueBypassingBindings
            ((QPropertyData<QFlags<QDBusServiceWatcher::WatchModeFlag>_> *)&in_RDI[6].d.ptr,&local_c
            );
  QPropertyData<QList<QString>_>::setValueBypassingBindings
            ((QPropertyData<QList<QString>_> *)in_RDI,in_stack_ffffffffffffff48);
  bVar1 = QDBusConnection::isConnected((QDBusConnection *)in_RDI);
  if (bVar1) {
    local_58.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    local_58 = QList<QString>::begin(in_RDI);
    o = QList<QString>::end(in_RDI);
    while (bVar1 = QList<QString>::const_iterator::operator!=(&local_58,o), bVar1) {
      QList<QString>::const_iterator::operator*(&local_58);
      addService(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                 (QFlagsStorageHelper<QDBusServiceWatcher::WatchModeFlag,_4>)
                 SUB84((ulong)in_RDX >> 0x20,0));
      QList<QString>::const_iterator::operator++(&local_58);
    }
  }
  QList<QString>::~QList((QList<QString> *)0x231d5e);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDBusServiceWatcherPrivate::setConnection(const QStringList &newServices,
                                               const QDBusConnection &newConnection,
                                               QDBusServiceWatcher::WatchMode newMode)
{
    const QStringList oldServices = watchedServicesData.valueBypassingBindings();
    const QDBusServiceWatcher::WatchMode oldMode = watchMode.valueBypassingBindings();
    if (connection.isConnected()) {
        // remove older rules
        for (const QString &s : oldServices)
            removeService(s, oldMode);
    }

    connection = newConnection;
    watchMode.setValueBypassingBindings(newMode); // caller has to call notify()
    watchedServicesData.setValueBypassingBindings(newServices); // caller has to call notify()

    if (connection.isConnected()) {
        // add new rules
        for (const QString &s : newServices)
            addService(s, newMode);
    }
}